

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O0

bool ON_GetGrevilleKnotVector
               (int g_stride,double *g,bool bPeriodic,int order,int cv_count,double *knot)

{
  double t;
  long lVar1;
  double N;
  int iVar2;
  int order_00;
  long lVar3;
  undefined1 *puVar4;
  double *pdVar5;
  double *__src;
  undefined8 uStack_a0;
  undefined1 auStack_98 [12];
  int local_8c;
  int local_88;
  int local_84;
  double dStack_80;
  int maxBj;
  double maxB;
  double *B;
  double dStack_68;
  int half_degree;
  double dd;
  double k;
  int degree;
  int j;
  int gi;
  int g_count;
  int knot_count;
  int ki;
  double *p;
  double *pdStack_30;
  bool rc;
  double *knot_local;
  int local_20;
  int cv_count_local;
  int order_local;
  bool bPeriodic_local;
  double *g_local;
  int g_stride_local;
  
  puVar4 = auStack_98;
  p._7_1_ = 0;
  _knot_count = (double *)0x0;
  if ((((g_stride < 1) || (g == (double *)0x0)) || (knot == (double *)0x0)) ||
     ((order < 2 || (cv_count < order)))) {
    g_local._7_1_ = false;
  }
  else if ((bPeriodic) && (order == 2)) {
    g_local._7_1_ = false;
  }
  else if ((bPeriodic) && ((cv_count - order) + 2 < 3)) {
    g_local._7_1_ = false;
  }
  else {
    k._0_4_ = order + -1;
    if (k._0_4_ == 1) {
      for (k._4_4_ = 0; k._4_4_ < cv_count; k._4_4_ = k._4_4_ + 1) {
        knot[k._4_4_] = g[k._4_4_ * g_stride];
      }
      g_local._7_1_ = true;
    }
    else {
      dStack_68 = 1.0 / (double)k._0_4_;
      uStack_a0 = 0x697bc0;
      pdStack_30 = knot;
      knot_local._4_4_ = cv_count;
      local_20 = order;
      cv_count_local._3_1_ = bPeriodic;
      _order_local = g;
      g_local._0_4_ = g_stride;
      gi = ON_KnotCount(order,cv_count);
      if ((cv_count_local._3_1_ & 1) == 0) {
        local_88 = knot_local._4_4_;
      }
      else {
        local_88 = (knot_local._4_4_ - local_20) + 2;
      }
      j = local_88;
      if ((cv_count_local._3_1_ & 1) == 0) {
        p._7_1_ = 1;
        if ((pdStack_30 < _order_local) && (_order_local < pdStack_30 + gi)) {
          uStack_a0 = 0x697fa1;
          _knot_count = (double *)onmalloc((long)knot_local._4_4_ << 3);
          for (k._4_4_ = 0; k._4_4_ < knot_local._4_4_; k._4_4_ = k._4_4_ + 1) {
            _knot_count[k._4_4_] = _order_local[k._4_4_ * (int)g_local];
          }
          g_local._0_4_ = 1;
          _order_local = _knot_count;
        }
        for (g_count = 0; g_count < k._0_4_; g_count = g_count + 1) {
          pdStack_30[g_count] = *_order_local;
        }
        degree = 1;
        for (g_count = k._0_4_; g_count < knot_local._4_4_; g_count = g_count + 1) {
          dd = 0.0;
          for (k._4_4_ = 0; k._4_4_ < k._0_4_; k._4_4_ = k._4_4_ + 1) {
            dd = _order_local[(degree + k._4_4_) * (int)g_local] + dd;
          }
          pdStack_30[g_count] = dd * dStack_68;
          if ((pdStack_30[g_count] < pdStack_30[g_count + -1]) ||
             (pdStack_30[g_count] <= pdStack_30[g_count - k._0_4_])) {
            p._7_1_ = 0;
          }
          degree = degree + 1;
        }
        for (g_count = knot_local._4_4_ + -1; g_count < gi; g_count = g_count + 1) {
          pdStack_30[g_count] = _order_local[(knot_local._4_4_ + -1) * (int)g_local];
        }
      }
      else {
        if (k._0_4_ % 2 == 0) {
          local_8c = 0;
        }
        else {
          local_8c = k._0_4_ / 2;
        }
        B._4_4_ = local_8c;
        uStack_a0 = 0x697c39;
        _knot_count = (double *)onmalloc((long)(local_88 + k._0_4_ * 2) << 3);
        degree = j - local_20;
        for (k._4_4_ = 0; k._4_4_ < k._0_4_; k._4_4_ = k._4_4_ + 1) {
          _knot_count[k._4_4_] = (*_order_local - _order_local[j + -1]) + _order_local[degree];
          degree = degree + 1;
        }
        k._4_4_ = k._0_4_;
        for (degree = 0; degree < j; degree = degree + 1) {
          _knot_count[k._4_4_] = _order_local[degree];
          k._4_4_ = k._4_4_ + 1;
        }
        degree = 1;
        for (k._4_4_ = j + k._0_4_; k._4_4_ < j + k._0_4_ * 2; k._4_4_ = k._4_4_ + 1) {
          _knot_count[k._4_4_] = (_order_local[j + -1] - *_order_local) + _order_local[degree];
          degree = degree + 1;
        }
        for (k._4_4_ = 0; k._4_4_ < j + local_20; k._4_4_ = k._4_4_ + 1) {
          dd = _knot_count[k._4_4_];
          for (g_count = 1; g_count < k._0_4_; g_count = g_count + 1) {
            dd = _knot_count[k._4_4_ + g_count] + dd;
          }
          dd = dStack_68 * dd;
          if ((B._4_4_ != 0) &&
             (ABS(dd - _knot_count[k._4_4_ + B._4_4_]) <=
              (_knot_count[k._4_4_ + k._0_4_ + -1] - _knot_count[k._4_4_]) * 1.490116119385e-08)) {
            dd = _knot_count[k._4_4_ + B._4_4_];
          }
          _knot_count[k._4_4_] = dd;
        }
        lVar1 = -((ulong)(uint)(local_20 * local_20) * 8 + 0xf & 0x7fffffff0);
        puVar4 = auStack_98 + lVar1;
        dStack_80 = 0.0;
        local_84 = 0;
        maxB = (double)puVar4;
        for (k._4_4_ = 0; iVar2 = local_20, pdVar5 = pdStack_30, N = maxB,
            SBORROW4(k._4_4_,k._0_4_ * 2) != k._4_4_ + k._0_4_ * -2 < 0; k._4_4_ = k._4_4_ + 1) {
          if (*_order_local < _knot_count[k._4_4_ + k._0_4_] ||
              *_order_local == _knot_count[k._4_4_ + k._0_4_]) {
            if (*_order_local < _knot_count[k._4_4_ + k._0_4_ + -1]) break;
            pdVar5 = _knot_count + k._4_4_;
            t = *_order_local;
            *(undefined8 *)(auStack_98 + lVar1 + -8) = 0x697f03;
            ON_EvaluateNurbsBasis(iVar2,pdVar5,t,(double *)N);
            if (dStack_80 < *(double *)maxB) {
              dStack_80 = *(double *)maxB;
              local_84 = k._4_4_;
            }
          }
        }
        __src = _knot_count + local_84;
        lVar3 = (long)gi;
        *(undefined8 *)(auStack_98 + lVar1 + -8) = 0x697f55;
        memcpy(pdVar5,__src,lVar3 << 3);
        order_00 = local_20;
        iVar2 = knot_local._4_4_;
        pdVar5 = pdStack_30;
        *(undefined8 *)(auStack_98 + lVar1 + -8) = 0x697f64;
        p._7_1_ = ON_MakeKnotVectorPeriodic(order_00,iVar2,pdVar5);
      }
      pdVar5 = _knot_count;
      if (_knot_count != (double *)0x0) {
        *(undefined8 *)(puVar4 + -8) = 0x698147;
        onfree(pdVar5);
      }
      g_local._7_1_ = (bool)(p._7_1_ & 1);
    }
  }
  return g_local._7_1_;
}

Assistant:

bool ON_GetGrevilleKnotVector( // get knots from Greville abcissa
          int g_stride,     
          const double *g,  // if not periodic, g[cv_count], 
                            // if periodic, g[cv_count-order+2]
                            // usually, g[0] = 0, g[i] = |P[i]-P[i-1]|^q
          bool bPeriodic,
          int order, 
          int cv_count, 
          double* knot
          )
{
  bool rc = false;
  double* p = nullptr;
  int ki, knot_count, g_count, gi, j, degree;
  double k, dd;

  if ( g_stride < 1 || !g || !knot || order < 2 || cv_count < order )
    return false;
  if ( bPeriodic && order == 2 )
    return false;
  if ( bPeriodic && cv_count - order + 2 < 3 )
    return false;

  degree = order-1;
  if ( degree == 1 ) {
    for ( j = 0; j < cv_count; j++ ) {
      knot[j] = g[j*g_stride];
    }
    return true;
  }
  dd = 1.0/degree;
  knot_count = ON_KnotCount( order, cv_count );
  g_count = (bPeriodic) ? cv_count-order+2 : cv_count;

  if ( bPeriodic ) {
    int half_degree = (degree%2) ? degree/2 : 0;
    // step 1: set p[] = fully periodic list of abcissa
    p = (double*)onmalloc((g_count + 2*degree)*sizeof(*p));
    for ( j = 0, gi = g_count-order; j < degree; j++, gi++ ) {
      p[j] = g[0] - g[g_count-1] + g[gi];
    }
    for ( gi = 0, j = degree; gi < g_count; gi++, j++ ) {
      p[j] = g[gi];
    }
    for ( j = g_count+degree, gi = 1; j < g_count+2*degree; j++, gi++ ) {
      p[j] = g[g_count-1] - g[0] + g[gi];
    }

    // step 2: set new p[i] = old (p[i] + ... + p[i+degree-1]) / degree
    for ( j = 0; j < g_count+order; j++ ) {
      k = p[j];
      for ( ki = 1; ki < degree; ki++ ) 
        k += p[j+ki];
      k *= dd;
      if ( half_degree ) {
        // if g[]'s are uniform and degree is odd, then knots = g[]'s
        if ( fabs(k-p[j+half_degree]) <=  ON_SQRT_EPSILON*(p[j+degree-1]-p[j]) )
          k = p[j+half_degree];
      }
      p[j] = k;
    }

    // step 3: determine where g[0] maximizes NURBS basis functions
    {
      double* B = (double*)alloca(order*order*sizeof(B[0]));
      double maxB  = 0.0;
      int maxBj = 0;
      for ( j = 0; j < 2*degree; j++ ) {
        if ( g[0] > p[j+degree] )
          continue;
        if ( g[0] < p[j+degree-1] )
          break;
        ON_EvaluateNurbsBasis( order, p+j, g[0], B );
        if ( B[0] > maxB ) {
          maxB  = B[0];
          maxBj = j;
        }
      }
      memcpy( knot, &p[maxBj], knot_count*sizeof(*knot) );
    }

    rc = ON_MakeKnotVectorPeriodic( order, cv_count, knot );
  }
  else {
    // clamped knots
    rc = true;
    if ( g > knot && g < knot+knot_count ) {
      p = (double*)onmalloc(cv_count*sizeof(*p));
      for( j = 0; j < cv_count; j++ ) {
        p[j] = g[j*g_stride];
      }
      g = p;
      g_stride = 1;
    }
    for ( ki = 0; ki < degree; ki++ ) {
      knot[ki] = g[0];
    }
    for ( ki = degree, gi = 1; ki < cv_count; ki++, gi++ ) {
      k = 0.0;
      for ( j = 0; j < degree; j++ ) {
        k += g[(gi+j)*g_stride];
      }
      knot[ki] = k*dd;
      if ( knot[ki] < knot[ki-1] || knot[ki] <= knot[ki-degree] ) {
        rc = false;
      }
    }
    for ( ki = cv_count-1; ki < knot_count; ki++ ) {
      knot[ki] = g[(cv_count-1)*g_stride];
    }
  }

  if (p)
    onfree(p);
  return rc;
}